

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.h
# Opt level: O3

void __thiscall
phyr::FilmTile::FilmTile
          (FilmTile *this,Bounds2i *pixelBounds,Vector2f *filterRadius,double *filterTable,
          int filterTableSize)

{
  pointer pFVar1;
  Point2<int> PVar2;
  double dVar3;
  uint uVar4;
  size_type __n;
  Vector2f VVar5;
  allocator_type local_29;
  vector<phyr::FilmTilePixel,_std::allocator<phyr::FilmTilePixel>_> local_28;
  
  PVar2 = pixelBounds->pMax;
  (this->pixelBounds).pMin = pixelBounds->pMin;
  (this->pixelBounds).pMax = PVar2;
  dVar3 = filterRadius->y;
  (this->filterRadius).x = filterRadius->x;
  (this->filterRadius).y = dVar3;
  VVar5 = (Vector2f)divpd(_DAT_001880c0,(undefined1  [16])*filterRadius);
  this->invFilterRadius = VVar5;
  this->filterTable = filterTable;
  this->filterTableSize = filterTableSize;
  (this->pixels).super__Vector_base<phyr::FilmTilePixel,_std::allocator<phyr::FilmTilePixel>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pixels).super__Vector_base<phyr::FilmTilePixel,_std::allocator<phyr::FilmTilePixel>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pixels).super__Vector_base<phyr::FilmTilePixel,_std::allocator<phyr::FilmTilePixel>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar4 = ((pixelBounds->pMax).y - (pixelBounds->pMin).y) *
          ((pixelBounds->pMax).x - (pixelBounds->pMin).x);
  __n = 0;
  if (0 < (int)uVar4) {
    __n = (size_type)uVar4;
  }
  std::vector<phyr::FilmTilePixel,_std::allocator<phyr::FilmTilePixel>_>::vector
            (&local_28,__n,&local_29);
  pFVar1 = (this->pixels).
           super__Vector_base<phyr::FilmTilePixel,_std::allocator<phyr::FilmTilePixel>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->pixels).super__Vector_base<phyr::FilmTilePixel,_std::allocator<phyr::FilmTilePixel>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_28.super__Vector_base<phyr::FilmTilePixel,_std::allocator<phyr::FilmTilePixel>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->pixels).super__Vector_base<phyr::FilmTilePixel,_std::allocator<phyr::FilmTilePixel>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_28.super__Vector_base<phyr::FilmTilePixel,_std::allocator<phyr::FilmTilePixel>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->pixels).super__Vector_base<phyr::FilmTilePixel,_std::allocator<phyr::FilmTilePixel>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_28.super__Vector_base<phyr::FilmTilePixel,_std::allocator<phyr::FilmTilePixel>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_28.super__Vector_base<phyr::FilmTilePixel,_std::allocator<phyr::FilmTilePixel>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.super__Vector_base<phyr::FilmTilePixel,_std::allocator<phyr::FilmTilePixel>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.super__Vector_base<phyr::FilmTilePixel,_std::allocator<phyr::FilmTilePixel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pFVar1 != (pointer)0x0) {
    operator_delete(pFVar1);
    if (local_28.super__Vector_base<phyr::FilmTilePixel,_std::allocator<phyr::FilmTilePixel>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_28.
                      super__Vector_base<phyr::FilmTilePixel,_std::allocator<phyr::FilmTilePixel>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

FilmTile(const Bounds2i& pixelBounds, const Vector2f& filterRadius,
             const Real* filterTable, int filterTableSize) :
        pixelBounds(pixelBounds), filterRadius(filterRadius),
        invFilterRadius(Real(1) / filterRadius.x, Real(1) / filterRadius.y),
        filterTable(filterTable), filterTableSize(filterTableSize) {
        // Allocate pixels
        pixels = std::vector<FilmTilePixel>(std::max(0, pixelBounds.area()));
    }